

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  array_container_t *src;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if ((r->high_low_container).size < 1) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = (r->high_low_container).typecodes[uVar5 & 0xffff];
      src = (array_container_t *)(r->high_low_container).containers[uVar5 & 0xffff];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&src->array;
        src = *(array_container_t **)src;
      }
      if (uVar1 == '\x01') {
        iVar2 = 0;
      }
      else if (uVar1 == '\x03') {
        iVar2 = run_container_shrink_to_fit((run_container_t *)src);
      }
      else {
        iVar2 = array_container_shrink_to_fit(src);
      }
      lVar3 = lVar3 + iVar2;
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < (r->high_low_container).size);
  }
  iVar2 = ra_shrink_to_fit(&r->high_low_container);
  return iVar2 + lVar3;
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}